

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  stbi__uint16 (*pasVar2) [64];
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  stbi__uint32 sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 z;
  undefined4 z_00;
  undefined4 uVar39;
  stbi__uint32 *psVar40;
  stbi__uint32 *psVar41;
  stbi__int16 (*pasVar42) [512];
  stbi_uc sVar43;
  byte bVar44;
  stbi_uc sVar45;
  stbi_uc sVar46;
  stbi_uc sVar47;
  byte bVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  stbi__uint32 sVar53;
  stbi__jpeg *psVar54;
  char *pcVar55;
  long lVar56;
  undefined7 extraout_var;
  stbi__uint16 *data_00;
  void *pvVar57;
  code *pcVar58;
  stbi__context *psVar59;
  float *data_01;
  uchar *puVar60;
  uint uVar61;
  ulong uVar62;
  stbi__context *psVar63;
  uchar *puVar64;
  undefined7 uVar66;
  undefined8 uVar65;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar67;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar68;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *extraout_RDX_17;
  stbi_uc *psVar69;
  short *psVar70;
  ulong uVar71;
  int *piVar72;
  stbi_uc *psVar73;
  stbi_uc *psVar74;
  byte *pbVar75;
  char cVar76;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar77;
  int iVar78;
  int iVar79;
  uint uVar80;
  stbi__uint16 *psVar81;
  stbi_uc (*pasVar82) [4];
  int iVar83;
  uint uVar84;
  ulong uVar85;
  long in_FS_OFFSET;
  bool bVar86;
  undefined1 auVar87 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  int iVar125;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  stbi_uc *coutput [4];
  short data [64];
  uint local_8998;
  ulong local_8990;
  int local_8964;
  undefined1 local_8948 [12];
  uint uStack_893c;
  undefined1 local_8938 [12];
  uint uStack_892c;
  int local_8928;
  uchar *local_8920;
  stbi__uint32 *local_8918;
  stbi__uint32 *local_8910;
  stbi__int16 (*local_8908) [512];
  uint local_88fc;
  anon_struct_96_18_0d0905d3 *local_88f8;
  ulong local_88f0;
  ulong local_88e8;
  stbi__context *local_88e0;
  stbi__uint32 local_88d8;
  uint local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  int local_88c0;
  int local_88bc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar69 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8918 = (stbi__uint32 *)x;
  local_8910 = (stbi__uint32 *)y;
  psVar54 = (stbi__jpeg *)malloc(0x4888);
  psVar54->s = s;
  psVar54->idct_block_kernel = stbi__idct_simd;
  psVar54->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar54->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar54->jfif = 0;
  psVar54->app14_color_transform = -1;
  psVar54->marker = 0xff;
  sVar43 = stbi__get_marker(psVar54);
  if (sVar43 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar54);
  if (sVar43 == 0xd8) {
    psVar54 = (stbi__jpeg *)malloc(0x4888);
    psVar54->s = s;
    psVar54->idct_block_kernel = stbi__idct_simd;
    psVar54->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar54->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar54->img_comp;
      lVar56 = 0x46d8;
      do {
        psVar69 = psVar54->huff_dc[0].fast + lVar56 + -8;
        psVar69[0] = '\0';
        psVar69[1] = '\0';
        psVar69[2] = '\0';
        psVar69[3] = '\0';
        psVar69[4] = '\0';
        psVar69[5] = '\0';
        psVar69[6] = '\0';
        psVar69[7] = '\0';
        psVar69[8] = '\0';
        psVar69[9] = '\0';
        psVar69[10] = '\0';
        psVar69[0xb] = '\0';
        psVar69[0xc] = '\0';
        psVar69[0xd] = '\0';
        psVar69[0xe] = '\0';
        psVar69[0xf] = '\0';
        lVar56 = lVar56 + 0x60;
      } while (lVar56 != 0x4858);
      psVar54->restart_interval = 0;
      iVar49 = stbi__decode_jpeg_header(psVar54,0);
      uVar84 = extraout_EDX;
      if (iVar49 != 0) {
        bVar44 = stbi__get_marker(psVar54);
        local_8908 = psVar54->fast_ac;
        pasVar2 = psVar54->dequant;
        psVar63 = (stbi__context *)pasVar2;
        do {
          if (bVar44 != 0xda) {
            if (bVar44 == 0xdc) {
              psVar63 = psVar54->s;
              sVar43 = stbi__get8(psVar63);
              sVar45 = stbi__get8(psVar63);
              psVar63 = psVar54->s;
              sVar46 = stbi__get8(psVar63);
              sVar47 = stbi__get8(psVar63);
              paVar68 = extraout_RDX;
              if (CONCAT11(sVar43,sVar45) == 4) {
                psVar63 = psVar54->s;
                if ((uint)CONCAT11(sVar46,sVar47) == psVar63->img_y) goto LAB_00134330;
                pcVar55 = "bad DNL height";
              }
              else {
                pcVar55 = "bad DNL len";
              }
              goto LAB_0013510c;
            }
            if (bVar44 == 0xd9) {
              if ((psVar54->progressive != 0) && (0 < psVar54->s->img_n)) {
                psVar63 = (stbi__context *)0x0;
                do {
                  iVar49 = psVar54->img_comp[(long)psVar63].y + 7 >> 3;
                  if (0 < iVar49) {
                    uVar84 = paVar1[(long)psVar63].x + 7 >> 3;
                    iVar79 = 0;
                    do {
                      if (0 < (int)uVar84) {
                        uVar71 = 0;
                        do {
                          psVar70 = paVar1[(long)psVar63].coeff +
                                    (paVar1[(long)psVar63].coeff_w * iVar79 + (int)uVar71) * 0x40;
                          iVar77 = paVar1[(long)psVar63].tq;
                          lVar56 = 0;
                          do {
                            psVar70[lVar56] = psVar70[lVar56] * pasVar2[iVar77][lVar56];
                            lVar56 = lVar56 + 1;
                          } while (lVar56 != 0x40);
                          (*psVar54->idct_block_kernel)
                                    (paVar1[(long)psVar63].data +
                                     uVar71 * 8 + (long)(iVar79 * 8 * paVar1[(long)psVar63].w2),
                                     paVar1[(long)psVar63].w2,psVar70);
                          uVar71 = uVar71 + 1;
                        } while (uVar71 != uVar84);
                      }
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != iVar49);
                  }
                  psVar63 = (stbi__context *)((long)&psVar63->img_x + 1);
                } while ((long)psVar63 < (long)psVar54->s->img_n);
              }
              if (req_comp == 0) {
                psVar63 = (stbi__context *)0x0;
                req_comp = (uint)(2 < psVar54->s->img_n) * 2 + 1;
              }
              uVar84 = psVar54->s->img_n;
              if (uVar84 == 3) {
                uVar66 = (undefined7)((ulong)psVar63 >> 8);
                uVar61 = (uint)CONCAT71(uVar66,1);
                if (psVar54->rgb != 3) {
                  if (psVar54->app14_color_transform != 0) goto LAB_0013489a;
                  uVar61 = (uint)CONCAT71(uVar66,psVar54->jfif == 0);
                }
              }
              else {
LAB_0013489a:
                uVar61 = 0;
              }
              local_8908 = (stbi__int16 (*) [512])CONCAT44(local_8908._4_4_,uVar61);
              uVar50 = 1;
              if ((uVar61 & 1) != 0) {
                uVar50 = uVar84;
              }
              if (2 < req_comp) {
                uVar50 = uVar84;
              }
              if (uVar84 != 3) {
                uVar50 = uVar84;
              }
              _local_8938 = (undefined1  [16])0x0;
              _local_8948 = (undefined1  [16])0x0;
              if ((int)uVar50 < 1) {
LAB_00134a22:
                psVar63 = psVar54->s;
                sVar53 = psVar63->img_y;
                psVar59 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar63->img_x,sVar53,1);
                iVar49 = (int)extraout_RDX_15;
                if (psVar59 != (stbi__context *)0x0) {
                  if (sVar53 != 0) {
                    local_8920 = (uchar *)((long)&psVar59->img_x + 2);
                    iVar79 = 0;
                    uVar84 = 0;
                    psVar69 = extraout_RDX_15;
                    do {
                      sVar53 = psVar63->img_x;
                      if (0 < (int)uVar50) {
                        pasVar82 = (stbi_uc (*) [4])&local_88a8.ratio;
                        uVar71 = 0;
                        piVar72 = &psVar54->img_comp[0].y;
                        do {
                          asVar5 = pasVar82[-1];
                          asVar6 = pasVar82[-3];
                          iVar49 = (int)asVar6 >> 1;
                          auVar126 = (**(code **)(pasVar82 + -10))
                                               (*(stbi_uc **)(piVar72 + 10),
                                                *(undefined8 *)
                                                 (*pasVar82 +
                                                 ((ulong)(iVar49 <= (int)asVar5) << 3 |
                                                 0xffffffffffffffe0)),
                                                *(undefined8 *)
                                                 (*pasVar82 +
                                                 ((ulong)((int)asVar5 < iVar49) << 3 |
                                                 0xffffffffffffffe0)),pasVar82[-2]);
                          psVar69 = auVar126._8_8_;
                          *(long *)(local_8948 + uVar71 * 8) = auVar126._0_8_;
                          pasVar82[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                          if ((int)asVar6 <= (int)asVar5 + 1) {
                            pasVar82[-1] = (stbi_uc  [4])0x0;
                            *(stbi_uc **)(pasVar82 + -8) = *(stbi_uc **)(pasVar82 + -6);
                            asVar5 = *pasVar82;
                            *pasVar82 = (stbi_uc  [4])((int)asVar5 + 1);
                            if ((int)asVar5 + 1 < *piVar72) {
                              *(stbi_uc **)(pasVar82 + -6) =
                                   *(stbi_uc **)(pasVar82 + -6) + piVar72[1];
                            }
                          }
                          uVar71 = uVar71 + 1;
                          piVar72 = piVar72 + 0x18;
                          pasVar82 = pasVar82 + 0xc;
                        } while (uVar50 != uVar71);
                      }
                      if (req_comp < 3) {
                        psVar63 = psVar54->s;
                        if ((char)local_8908 == '\0') {
                          if (psVar63->img_n == 4) {
                            if (psVar54->app14_color_transform == 2) {
                              if (psVar63->img_x != 0) {
                                psVar73 = psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x37);
                                uVar71 = 0;
                                do {
                                  iVar49 = (*(byte *)(local_8948._0_8_ + uVar71) ^ 0xff) *
                                           (uint)stack0xffffffffffff76d0[uVar71];
                                  psVar73[-1] = (char)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                  *psVar73 = 0xff;
                                  uVar71 = uVar71 + 1;
                                  psVar73 = psVar73 + (uint)req_comp;
                                  psVar69 = stack0xffffffffffff76d0;
                                } while (uVar71 < psVar63->img_x);
                              }
                            }
                            else {
                              if (psVar54->app14_color_transform != 0) goto LAB_00134e4a;
                              if (psVar63->img_x != 0) {
                                psVar73 = psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x37);
                                uVar71 = 0;
                                do {
                                  bVar44 = stack0xffffffffffff76d0[uVar71];
                                  iVar49 = (uint)*(byte *)(local_8948._0_8_ + uVar71) * (uint)bVar44
                                  ;
                                  iVar77 = (uint)stack0xffffffffffff76c0[uVar71] * (uint)bVar44;
                                  psVar73[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar71) *
                                                        (uint)bVar44 +
                                                        ((uint)*(byte *)(local_8938._0_8_ + uVar71)
                                                         * (uint)bVar44 + 0x80 >> 8) + 0x80 >> 8 &
                                                       0xff) * 0x1d +
                                                       (iVar77 + (iVar77 + 0x80U >> 8) + 0x80 >> 8 &
                                                       0xff) * 0x96 +
                                                       (iVar49 + (iVar49 + 0x80U >> 8) + 0x80 >> 8 &
                                                       0xff) * 0x4d >> 8);
                                  *psVar73 = 0xff;
                                  uVar71 = uVar71 + 1;
                                  psVar73 = psVar73 + (uint)req_comp;
                                  psVar69 = (stbi_uc *)local_8948._0_8_;
                                } while (uVar71 < psVar63->img_x);
                              }
                            }
                          }
                          else {
LAB_00134e4a:
                            uVar61 = psVar63->img_x;
                            psVar69 = (stbi_uc *)(ulong)uVar61;
                            if (req_comp == 1) {
                              if (uVar61 != 0) {
                                psVar69 = (stbi_uc *)0x0;
                                do {
                                  (psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x38))
                                  [(long)psVar69] = *(stbi_uc *)(local_8948._0_8_ + (long)psVar69);
                                  psVar69 = psVar69 + 1;
                                } while (psVar69 < (stbi_uc *)(ulong)psVar63->img_x);
                              }
                            }
                            else if (uVar61 != 0) {
                              psVar69 = (stbi_uc *)0x0;
                              do {
                                psVar59->buffer_start
                                [(long)psVar69 * 2 + (ulong)(sVar53 * iVar79) + -0x38] =
                                     *(stbi_uc *)(local_8948._0_8_ + (long)psVar69);
                                psVar59->buffer_start
                                [(long)psVar69 * 2 + (ulong)(sVar53 * iVar79) + -0x37] = 0xff;
                                psVar69 = psVar69 + 1;
                              } while (psVar69 < (stbi_uc *)(ulong)psVar63->img_x);
                            }
                          }
                        }
                        else if (req_comp == 1) {
                          if (psVar63->img_x != 0) {
                            uVar71 = 0;
                            do {
                              bVar44 = *(byte *)(local_8938._0_8_ + uVar71);
                              psVar59->buffer_start[uVar71 + sVar53 * iVar79 + -0x38] =
                                   (stbi_uc)((uint)bVar44 * 2 +
                                             ((uint)bVar44 + (uint)bVar44 * 8) * 3 +
                                             (uint)stack0xffffffffffff76c0[uVar71] * 0x96 +
                                             (uint)*(byte *)(local_8948._0_8_ + uVar71) * 0x4d >> 8)
                              ;
                              uVar71 = uVar71 + 1;
                              psVar69 = stack0xffffffffffff76c0;
                            } while (uVar71 < psVar63->img_x);
                          }
                        }
                        else if (psVar63->img_x != 0) {
                          uVar71 = 0;
                          do {
                            bVar44 = *(byte *)(local_8938._0_8_ + uVar71);
                            psVar59->buffer_start[uVar71 * 2 + (ulong)(sVar53 * iVar79) + -0x38] =
                                 (stbi_uc)((uint)bVar44 * 2 + ((uint)bVar44 + (uint)bVar44 * 8) * 3
                                           + (uint)stack0xffffffffffff76c0[uVar71] * 0x96 +
                                             (uint)*(byte *)(local_8948._0_8_ + uVar71) * 0x4d >> 8)
                            ;
                            psVar59->buffer_start[uVar71 * 2 + (ulong)(sVar53 * iVar79) + -0x37] =
                                 0xff;
                            uVar71 = uVar71 + 1;
                            psVar69 = stack0xffffffffffff76c0;
                          } while (uVar71 < psVar63->img_x);
                        }
                      }
                      else {
                        psVar63 = psVar54->s;
                        if (psVar63->img_n == 3) {
                          if ((char)local_8908 == '\0') {
LAB_00134ebc:
                            (*psVar54->YCbCr_to_RGB_kernel)
                                      (psVar59->buffer_start +
                                       ((ulong)(uVar84 * req_comp * sVar53) - 0x38),
                                       (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                       (stbi_uc *)local_8938._0_8_,psVar63->img_x,req_comp);
                            psVar69 = extraout_RDX_16;
                          }
                          else if (psVar63->img_x != 0) {
                            psVar73 = psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x35);
                            uVar71 = 0;
                            do {
                              psVar73[-3] = *(stbi_uc *)(local_8948._0_8_ + uVar71);
                              psVar73[-2] = stack0xffffffffffff76c0[uVar71];
                              psVar73[-1] = *(stbi_uc *)(local_8938._0_8_ + uVar71);
                              *psVar73 = 0xff;
                              uVar71 = uVar71 + 1;
                              psVar73 = psVar73 + (uint)req_comp;
                              psVar69 = (stbi_uc *)local_8938._0_8_;
                            } while (uVar71 < psVar63->img_x);
                          }
                        }
                        else if (psVar63->img_n == 4) {
                          if (psVar54->app14_color_transform == 2) {
                            (*psVar54->YCbCr_to_RGB_kernel)
                                      (psVar59->buffer_start +
                                       ((ulong)(uVar84 * req_comp * sVar53) - 0x38),
                                       (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                       (stbi_uc *)local_8938._0_8_,psVar63->img_x,req_comp);
                            psVar63 = psVar54->s;
                            psVar69 = extraout_RDX_17;
                            if (psVar63->img_x != 0) {
                              pbVar75 = local_8920 + sVar53 * iVar79;
                              psVar69 = (stbi_uc *)0x0;
                              do {
                                bVar44 = psVar69[(long)stack0xffffffffffff76d0];
                                iVar49 = (pbVar75[-2] ^ 0xff) * (uint)bVar44;
                                pbVar75[-2] = (byte)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                iVar49 = (pbVar75[-1] ^ 0xff) * (uint)bVar44;
                                pbVar75[-1] = (byte)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                iVar49 = (*pbVar75 ^ 0xff) * (uint)bVar44;
                                *pbVar75 = (byte)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                psVar69 = psVar69 + 1;
                                pbVar75 = pbVar75 + (uint)req_comp;
                              } while (psVar69 < (stbi_uc *)(ulong)psVar63->img_x);
                            }
                          }
                          else {
                            if (psVar54->app14_color_transform != 0) goto LAB_00134ebc;
                            if (psVar63->img_x != 0) {
                              psVar73 = psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x35);
                              uVar71 = 0;
                              do {
                                bVar44 = stack0xffffffffffff76d0[uVar71];
                                iVar49 = (uint)*(byte *)(local_8948._0_8_ + uVar71) * (uint)bVar44;
                                psVar73[-3] = (char)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                iVar49 = (uint)stack0xffffffffffff76c0[uVar71] * (uint)bVar44;
                                psVar73[-2] = (char)((iVar49 + 0x80U >> 8) + iVar49 + 0x80 >> 8);
                                psVar73[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar71) *
                                                      (uint)bVar44 + 0x80 >> 8) +
                                                     (uint)*(byte *)(local_8938._0_8_ + uVar71) *
                                                     (uint)bVar44 + 0x80 >> 8);
                                *psVar73 = 0xff;
                                uVar71 = uVar71 + 1;
                                psVar73 = psVar73 + (uint)req_comp;
                                psVar69 = stack0xffffffffffff76c0;
                              } while (uVar71 < psVar63->img_x);
                            }
                          }
                        }
                        else if (psVar63->img_x != 0) {
                          psVar74 = psVar59->buffer_start + ((ulong)(sVar53 * iVar79) - 0x35);
                          psVar73 = (stbi_uc *)0x0;
                          do {
                            sVar43 = *(stbi_uc *)(local_8948._0_8_ + (long)psVar73);
                            psVar74[-1] = sVar43;
                            psVar74[-2] = sVar43;
                            psVar74[-3] = sVar43;
                            *psVar74 = 0xff;
                            psVar73 = psVar73 + 1;
                            psVar69 = (stbi_uc *)(ulong)psVar63->img_x;
                            psVar74 = psVar74 + (uint)req_comp;
                          } while (psVar73 < psVar69);
                        }
                      }
                      iVar49 = (int)psVar69;
                      uVar84 = uVar84 + 1;
                      psVar63 = psVar54->s;
                      iVar79 = iVar79 + req_comp;
                    } while (uVar84 < psVar63->img_y);
                  }
                  stbi__free_jpeg_components(psVar54,psVar63->img_n,iVar49);
                  psVar63 = psVar54->s;
                  *local_8918 = psVar63->img_x;
                  *local_8910 = psVar63->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar63->img_n) * 2 + 1;
                  }
                  goto LAB_0013512a;
                }
                stbi__free_jpeg_components(psVar54,psVar63->img_n,iVar49);
                pcVar55 = "outofmem";
                goto LAB_001333e4;
              }
              lVar56 = 0;
              while( true ) {
                psVar63 = psVar54->s;
                sVar53 = psVar63->img_x;
                pvVar57 = malloc((ulong)(sVar53 + 3));
                *(void **)((long)&psVar54->img_comp[0].linebuf + lVar56 * 2) = pvVar57;
                if (pvVar57 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar54,psVar63->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                }
                else {
                  uVar71 = (long)psVar54->img_h_max /
                           (long)*(int *)((long)&psVar54->img_comp[0].h + lVar56 * 2);
                  iVar49 = (int)uVar71;
                  *(int *)((long)(local_88a8.pal + -7) + lVar56) = iVar49;
                  iVar79 = psVar54->img_v_max / *(int *)((long)&psVar54->img_comp[0].v + lVar56 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar56) = iVar79;
                  *(int *)((long)(local_88a8.pal + -4) + lVar56) = iVar79 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar56) =
                       (int)((ulong)((sVar53 + iVar49) - 1) / (uVar71 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar56) = 0;
                  uVar65 = *(undefined8 *)((long)&psVar54->img_comp[0].data + lVar56 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar56) = uVar65;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar56) = uVar65;
                  if ((iVar49 == 1) && (iVar79 == 1)) {
                    *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar56) =
                         resample_row_1;
                  }
                  else {
                    if ((iVar49 == 1) && (iVar79 == 2)) {
                      pcVar58 = stbi__resample_row_v_2;
                    }
                    else if ((iVar49 == 2) && (iVar79 == 1)) {
                      pcVar58 = stbi__resample_row_h_2;
                    }
                    else if ((iVar49 == 2) && (iVar79 == 2)) {
                      pcVar58 = psVar54->resample_row_hv_2_kernel;
                    }
                    else {
                      pcVar58 = stbi__resample_row_generic;
                    }
                    *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar56) = pcVar58;
                  }
                }
                if (pvVar57 == (void *)0x0) break;
                lVar56 = lVar56 + 0x30;
                if ((ulong)uVar50 * 0x30 == lVar56) goto LAB_00134a22;
              }
              goto LAB_00135124;
            }
            iVar49 = stbi__process_marker(psVar54,(uint)bVar44);
            uVar84 = extraout_EDX_00;
            if (iVar49 != 0) goto LAB_00134330;
            break;
          }
          psVar63 = psVar54->s;
          sVar43 = stbi__get8(psVar63);
          sVar45 = stbi__get8(psVar63);
          uVar71 = CONCAT71(extraout_var,sVar45) & 0xffffffff;
          bVar44 = stbi__get8(psVar54->s);
          psVar54->scan_n = (uint)bVar44;
          if (((byte)(bVar44 - 5) < 0xfc) || (psVar54->s->img_n < (int)(uint)bVar44)) {
            pcVar55 = "bad SOS component count";
            paVar68 = extraout_RDX_00;
LAB_0013510c:
            uVar84 = (uint)paVar68;
            *(char **)(in_FS_OFFSET + -0x10) = pcVar55;
            break;
          }
          paVar68 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar43,sVar45);
          if ((uint)CONCAT11(sVar43,sVar45) != (uint)bVar44 * 2 + 6) {
            pcVar55 = "bad SOS len";
            goto LAB_0013510c;
          }
          if (bVar44 != 0) {
            lVar56 = 0;
            do {
              bVar44 = stbi__get8(psVar54->s);
              bVar48 = stbi__get8(psVar54->s);
              uVar84 = psVar54->s->img_n;
              if ((int)uVar84 < 1) {
                uVar62 = 0;
              }
              else {
                uVar62 = 0;
                paVar68 = paVar1;
                do {
                  if (paVar68->id == (uint)bVar44) goto LAB_0013362b;
                  uVar62 = uVar62 + 1;
                  paVar68 = paVar68 + 1;
                } while (uVar84 != uVar62);
                uVar62 = (ulong)uVar84;
              }
LAB_0013362b:
              if ((uint)uVar62 == uVar84) goto LAB_00135115;
              uVar85 = uVar62 & 0xffffffff;
              paVar68 = (anon_struct_96_18_0d0905d3 *)(uVar85 * 0x60);
              psVar54->img_comp[uVar85].hd = (uint)(bVar48 >> 4);
              if (0x3f < bVar48) {
                pcVar55 = "bad DC huff";
                goto LAB_0013510c;
              }
              paVar68 = paVar1 + uVar85;
              paVar68->ha = bVar48 & 0xf;
              if (3 < (bVar48 & 0xf)) {
                pcVar55 = "bad AC huff";
                goto LAB_0013510c;
              }
              psVar54->order[lVar56] = (uint)uVar62;
              lVar56 = lVar56 + 1;
            } while (lVar56 < psVar54->scan_n);
          }
          bVar44 = stbi__get8(psVar54->s);
          psVar54->spec_start = (uint)bVar44;
          bVar44 = stbi__get8(psVar54->s);
          psVar54->spec_end = (uint)bVar44;
          bVar44 = stbi__get8(psVar54->s);
          psVar54->succ_high = (uint)(bVar44 >> 4);
          uVar84 = bVar44 & 0xf;
          paVar68 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar84;
          psVar54->succ_low = uVar84;
          uVar61 = psVar54->progressive;
          psVar63 = (stbi__context *)(ulong)uVar61;
          iVar49 = psVar54->spec_start;
          if (uVar61 == 0) {
            if (((iVar49 != 0) || (0xf < bVar44)) || ((bVar44 & 0xf) != 0)) goto LAB_0013475a;
            psVar54->spec_end = 0x3f;
          }
          else if (((0x3f < iVar49) || (0x3f < psVar54->spec_end)) ||
                  ((psVar54->spec_end < iVar49 || ((0xdf < bVar44 || (0xd < uVar84)))))) {
LAB_0013475a:
            pcVar55 = "bad SOS";
            goto LAB_0013510c;
          }
          iVar49 = psVar54->scan_n;
          uVar62 = (ulong)(uint)psVar54->restart_interval;
          if (psVar54->restart_interval == 0) {
            uVar62 = 0x7fffffff;
          }
          psVar54->code_buffer = 0;
          psVar54->code_bits = 0;
          psVar54->nomore = 0;
          psVar54->img_comp[3].dc_pred = 0;
          psVar54->img_comp[2].dc_pred = 0;
          psVar54->img_comp[1].dc_pred = 0;
          psVar54->img_comp[0].dc_pred = 0;
          psVar54->marker = 0xff;
          uVar84 = (uint)uVar62;
          psVar54->todo = uVar84;
          psVar54->eob_run = 0;
          if (uVar61 == 0) {
            if (iVar49 == 1) {
              iVar79 = psVar54->order[0];
              iVar77 = psVar54->img_comp[iVar79].y + 7 >> 3;
              iVar49 = 1;
              if (0 < iVar77) {
                uVar61 = paVar1[iVar79].x + 7 >> 3;
                iVar51 = 0;
                iVar49 = 0;
                do {
                  if (0 < (int)uVar61) {
                    lVar56 = 0;
                    do {
                      psVar63 = (stbi__context *)psVar54->huff_ac[paVar1[iVar79].ha].fast;
                      iVar83 = stbi__jpeg_decode_block
                                         (psVar54,(short *)&local_88a8,
                                          (stbi__huffman *)psVar54->huff_dc[paVar1[iVar79].hd].fast,
                                          (stbi__huffman *)psVar63,local_8908[paVar1[iVar79].ha],
                                          iVar79,pasVar2[paVar1[iVar79].tq]);
                      if (iVar83 == 0) {
                        bVar86 = false;
                        local_8990 = 0;
                        uVar62 = extraout_RDX_09;
                      }
                      else {
                        (*psVar54->idct_block_kernel)
                                  (paVar1[iVar79].data + lVar56 + iVar51 * paVar1[iVar79].w2,
                                   paVar1[iVar79].w2,(short *)&local_88a8);
                        iVar83 = psVar54->todo;
                        uVar84 = iVar83 - 1;
                        psVar63 = (stbi__context *)(ulong)uVar84;
                        psVar54->todo = uVar84;
                        bVar86 = true;
                        uVar62 = extraout_RDX_10;
                        if (iVar83 < 2) {
                          if (psVar54->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar54);
                            uVar62 = extraout_RDX_11;
                          }
                          if ((psVar54->marker & 0xf8) == 0xd0) {
                            psVar54->code_buffer = 0;
                            psVar54->code_bits = 0;
                            psVar63 = (stbi__context *)0x0;
                            psVar54->nomore = 0;
                            psVar54->img_comp[3].dc_pred = 0;
                            psVar54->img_comp[2].dc_pred = 0;
                            psVar54->img_comp[1].dc_pred = 0;
                            psVar54->img_comp[0].dc_pred = 0;
                            psVar54->marker = 0xff;
                            iVar83 = psVar54->restart_interval;
                            uVar62 = 0x7fffffff;
                            if (iVar83 == 0) {
                              iVar83 = 0x7fffffff;
                            }
                            psVar54->todo = iVar83;
                            psVar54->eob_run = 0;
                          }
                          else {
                            local_8990 = 1;
                            bVar86 = false;
                          }
                        }
                      }
                      uVar84 = (uint)uVar62;
                      if (!bVar86) {
                        iVar49 = (int)local_8990;
                        goto LAB_001342d5;
                      }
                      lVar56 = lVar56 + 8;
                    } while ((ulong)uVar61 * 8 - lVar56 != 0);
                  }
                  uVar84 = (uint)uVar62;
                  iVar49 = iVar49 + 1;
                  iVar51 = iVar51 + 8;
                } while (iVar49 != iVar77);
                goto LAB_00133ebc;
              }
            }
            else {
              iVar49 = 1;
              if (0 < psVar54->img_mcu_y) {
                iVar79 = 0;
                do {
                  if (0 < psVar54->img_mcu_x) {
                    iVar77 = 0;
                    do {
                      if (0 < psVar54->scan_n) {
                        puVar64 = (uchar *)0x0;
                        do {
                          iVar49 = psVar54->order[(long)puVar64];
                          local_8990 = (ulong)iVar49;
                          local_8920 = puVar64;
                          if (0 < psVar54->img_comp[local_8990].v) {
                            iVar51 = 0;
                            bVar86 = true;
                            do {
                              iVar83 = paVar1[local_8990].h;
                              if (0 < iVar83) {
                                iVar78 = 0;
                                do {
                                  iVar125 = paVar1[local_8990].v;
                                  psVar63 = (stbi__context *)
                                            psVar54->huff_ac[paVar1[local_8990].ha].fast;
                                  iVar52 = stbi__jpeg_decode_block
                                                     (psVar54,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar54->huff_dc[paVar1[local_8990].hd].fast,
                                                      (stbi__huffman *)psVar63,
                                                      local_8908[paVar1[local_8990].ha],iVar49,
                                                      pasVar2[paVar1[local_8990].tq]);
                                  uVar84 = (uint)extraout_RDX_13;
                                  if (iVar52 == 0) {
                                    uVar62 = extraout_RDX_13;
                                    if (!bVar86) goto LAB_001341d5;
                                    goto LAB_001342bf;
                                  }
                                  (*psVar54->idct_block_kernel)
                                            (paVar1[local_8990].data +
                                             (long)((iVar83 * iVar77 + iVar78) * 8) +
                                             (long)((iVar125 * iVar79 + iVar51) *
                                                    paVar1[local_8990].w2 * 8),paVar1[local_8990].w2
                                             ,(short *)&local_88a8);
                                  iVar78 = iVar78 + 1;
                                  iVar83 = paVar1[local_8990].h;
                                  uVar62 = extraout_RDX_14;
                                } while (iVar78 < iVar83);
                              }
                              iVar51 = iVar51 + 1;
                              bVar86 = iVar51 < paVar1[local_8990].v;
                            } while (iVar51 < paVar1[local_8990].v);
                          }
LAB_001341d5:
                          puVar64 = local_8920 + 1;
                        } while ((long)puVar64 < (long)psVar54->scan_n);
                      }
                      uVar84 = (uint)uVar62;
                      iVar51 = psVar54->todo;
                      uVar61 = iVar51 - 1;
                      psVar63 = (stbi__context *)(ulong)uVar61;
                      psVar54->todo = uVar61;
                      iVar49 = 1;
                      if (iVar51 < 2) {
                        if (psVar54->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar54);
                          uVar84 = extraout_EDX_02;
                        }
                        if ((psVar54->marker & 0xf8) != 0xd0) goto LAB_001342d5;
                        psVar54->code_buffer = 0;
                        psVar54->code_bits = 0;
                        psVar63 = (stbi__context *)0x0;
                        psVar54->nomore = 0;
                        psVar54->img_comp[3].dc_pred = 0;
                        psVar54->img_comp[2].dc_pred = 0;
                        psVar54->img_comp[1].dc_pred = 0;
                        psVar54->img_comp[0].dc_pred = 0;
                        psVar54->marker = 0xff;
                        iVar49 = psVar54->restart_interval;
                        uVar62 = 0x7fffffff;
                        if (iVar49 == 0) {
                          iVar49 = 0x7fffffff;
                        }
                        psVar54->todo = iVar49;
                        psVar54->eob_run = 0;
                      }
                      iVar77 = iVar77 + 1;
                    } while (iVar77 < psVar54->img_mcu_x);
                  }
                  uVar84 = (uint)uVar62;
                  iVar49 = 1;
                  iVar79 = iVar79 + 1;
                } while (iVar79 < psVar54->img_mcu_y);
              }
            }
          }
          else if (iVar49 == 1) {
            local_88e0 = (stbi__context *)(long)psVar54->order[0];
            uVar61 = psVar54->img_comp[(long)local_88e0].y + 7 >> 3;
            psVar63 = (stbi__context *)(ulong)uVar61;
            iVar49 = 1;
            local_88e8 = CONCAT44(local_88e8._4_4_,uVar61);
            if (0 < (int)uVar61) {
              paVar68 = paVar1 + (long)local_88e0;
              local_88f0 = CONCAT44(local_88f0._4_4_,psVar54->img_comp[(long)local_88e0].x + 7 >> 3)
              ;
              local_8964 = 0;
              local_88f8 = paVar68;
              do {
                if (0 < (int)(uint)local_88f0) {
                  psVar63 = (stbi__context *)0x0;
                  do {
                    pasVar42 = local_8908;
                    iVar79 = (int)psVar63;
                    psVar70 = paVar68->coeff + (paVar68->coeff_w * local_8964 + iVar79) * 0x40;
                    uVar85 = (ulong)psVar54->spec_start;
                    if (uVar85 == 0) {
                      psVar63 = local_88e0;
                      iVar49 = stbi__jpeg_decode_block_prog_dc
                                         (psVar54,psVar70,
                                          (stbi__huffman *)psVar54->huff_dc[paVar68->hd].fast,
                                          (int)local_88e0);
                      uVar62 = extraout_RDX_02;
                      if (iVar49 != 0) goto LAB_00133ac3;
                      bVar86 = false;
                      uVar71 = 0;
                    }
                    else {
                      iVar49 = paVar68->ha;
                      psVar69 = psVar54->huff_ac[iVar49].fast;
                      uVar84 = psVar54->succ_low;
                      iVar77 = psVar54->eob_run;
                      local_8920 = (uchar *)CONCAT44(local_8920._4_4_,(int)uVar71);
                      bVar44 = (byte)uVar84;
                      if (psVar54->succ_high == 0) {
                        if (iVar77 == 0) {
                          do {
                            if (psVar54->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar54);
                            }
                            uVar84 = (uint)pasVar42[iVar49][psVar54->code_buffer >> 0x17];
                            iVar77 = (int)uVar85;
                            if (pasVar42[iVar49][psVar54->code_buffer >> 0x17] == 0) {
                              uVar84 = stbi__jpeg_huff_decode(psVar54,(stbi__huffman *)psVar69);
                              if (-1 < (int)uVar84) {
                                uVar61 = uVar84 >> 4;
                                if ((uVar84 & 0xf) == 0) {
                                  if (uVar84 < 0xf0) {
                                    psVar54->eob_run = 1 << ((byte)uVar61 & 0x1f);
                                    if (0xf < uVar84) {
                                      iVar77 = stbi__jpeg_get_bits(psVar54,uVar61);
                                      psVar54->eob_run = psVar54->eob_run + iVar77;
                                    }
                                    psVar54->eob_run = psVar54->eob_run + -1;
                                    psVar63 = (stbi__context *)0x2;
                                    goto LAB_00133cbc;
                                  }
                                  uVar85 = (ulong)(iVar77 + 0x10);
                                  uVar71 = extraout_RDX_07;
                                }
                                else {
                                  uVar85 = (ulong)((int)((long)iVar77 + (ulong)uVar61) + 1);
                                  bVar48 = ""[(long)iVar77 + (ulong)uVar61];
                                  iVar77 = stbi__extend_receive(psVar54,uVar84 & 0xf);
                                  psVar70[bVar48] = (short)(iVar77 << (bVar44 & 0x1f));
                                  uVar71 = extraout_RDX_08;
                                }
                                goto LAB_00133c00;
                              }
                              *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                              psVar63 = (stbi__context *)0x1;
LAB_00133cbc:
                              uVar62 = 0;
                            }
                            else {
                              psVar54->code_buffer = psVar54->code_buffer << (sbyte)(uVar84 & 0xf);
                              uVar71 = (ulong)(uVar84 >> 4 & 0xf);
                              psVar54->code_bits = psVar54->code_bits - (uVar84 & 0xf);
                              uVar85 = (ulong)((int)((long)iVar77 + uVar71) + 1);
                              psVar70[""[(long)iVar77 + uVar71]] =
                                   (short)((uVar84 >> 8) << (bVar44 & 0x1f));
LAB_00133c00:
                              psVar63 = (stbi__context *)0x0;
                              uVar62 = CONCAT71((int7)(uVar71 >> 8),1);
                            }
                            bVar86 = false;
                            cVar76 = '\x01';
                            if ((int)psVar63 != 0) {
                              bVar86 = false;
                              if ((int)psVar63 != 2) {
                                cVar76 = (char)uVar62;
                                bVar86 = false;
                              }
                              break;
                            }
                          } while ((int)uVar85 <= psVar54->spec_end);
                        }
                        else {
                          psVar54->eob_run = iVar77 + -1;
                          cVar76 = '\0';
                          bVar86 = true;
                        }
                        if (cVar76 != '\0') goto LAB_00133a9f;
                      }
                      else {
                        if (iVar77 == 0) {
                          psVar63 = (stbi__context *)(ulong)uVar84;
                          uVar61 = (0x10000 << (bVar44 & 0x1f)) >> 0x10;
                          do {
                            uVar50 = stbi__jpeg_huff_decode(psVar54,(stbi__huffman *)psVar69);
                            uVar62 = extraout_RDX_03;
                            if ((int)uVar50 < 0) {
LAB_001339d0:
                              *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                              bVar86 = false;
                            }
                            else {
                              psVar63 = (stbi__context *)0x0;
                              uVar80 = uVar50 >> 4;
                              if ((uVar50 & 0xf) == 1) {
                                iVar77 = stbi__jpeg_get_bit(psVar54);
                                iVar49 = 1;
                                if (iVar77 == 0) {
                                  iVar49 = 0xffff;
                                }
                                psVar63 = (stbi__context *)(ulong)uVar84;
                                uVar50 = iVar49 << (bVar44 & 0x1f);
                                uVar62 = (ulong)uVar50;
                                local_8990 = (ulong)uVar50;
                              }
                              else {
                                if ((uVar50 & 0xf) != 0) goto LAB_001339d0;
                                if (uVar50 < 0xf0) {
                                  psVar63 = (stbi__context *)(ulong)uVar80;
                                  uVar67 = ~(-1 << ((byte)uVar80 & 0x1f));
                                  uVar62 = (ulong)uVar67;
                                  psVar54->eob_run = uVar67;
                                  uVar67 = 0x40;
                                  if (0xf < uVar50) {
                                    iVar49 = stbi__jpeg_get_bits(psVar54,uVar80);
                                    psVar54->eob_run = psVar54->eob_run + iVar49;
                                    uVar62 = extraout_RDX_04;
                                  }
                                }
                                else {
                                  uVar67 = 0xf;
                                }
                                uVar80 = uVar67;
                                local_8990 = 0;
                              }
                              uVar85 = (ulong)(int)uVar85;
                              do {
                                if ((long)psVar54->spec_end < (long)uVar85) break;
                                bVar48 = ""[uVar85];
                                if (psVar70[bVar48] == 0) {
                                  if (uVar80 == 0) {
                                    psVar70[bVar48] = (short)local_8990;
                                    psVar63 = (stbi__context *)0x0;
                                    uVar80 = 0;
                                  }
                                  else {
                                    uVar80 = uVar80 - 1;
                                    psVar63 = (stbi__context *)
                                              CONCAT71((int7)((ulong)psVar63 >> 8),1);
                                  }
                                }
                                else {
                                  iVar49 = stbi__jpeg_get_bit(psVar54);
                                  psVar63 = (stbi__context *)CONCAT71((int7)((ulong)psVar63 >> 8),1)
                                  ;
                                  uVar62 = extraout_RDX_05;
                                  if ((iVar49 != 0) &&
                                     (sVar4 = psVar70[bVar48], (uVar61 & (int)sVar4) == 0)) {
                                    uVar50 = uVar61;
                                    if (sVar4 < 1) {
                                      uVar50 = -uVar61;
                                    }
                                    psVar70[bVar48] = sVar4 + (short)uVar50;
                                  }
                                }
                                uVar85 = uVar85 + 1;
                              } while ((char)psVar63 != '\0');
                              bVar86 = true;
                            }
                            if (!bVar86) {
                              bVar86 = false;
                              goto LAB_00133aa4;
                            }
                          } while ((int)uVar85 <= psVar54->spec_end);
                        }
                        else {
                          psVar54->eob_run = iVar77 + -1;
                          if (psVar54->spec_start <= psVar54->spec_end) {
                            uVar84 = (0x10000 << (bVar44 & 0x1f)) >> 0x10;
                            do {
                              bVar44 = ""[uVar85];
                              if (((psVar70[bVar44] != 0) &&
                                  (iVar49 = stbi__jpeg_get_bit(psVar54), uVar62 = extraout_RDX_01,
                                  iVar49 != 0)) &&
                                 (sVar4 = psVar70[bVar44], (uVar84 & (int)sVar4) == 0)) {
                                uVar61 = -uVar84;
                                if (0 < sVar4) {
                                  uVar61 = uVar84;
                                }
                                psVar70[bVar44] = (short)uVar61 + sVar4;
                              }
                              psVar63 = (stbi__context *)(long)psVar54->spec_end;
                              bVar86 = (long)uVar85 < (long)psVar63;
                              uVar85 = uVar85 + 1;
                            } while (bVar86);
                          }
                        }
LAB_00133a9f:
                        bVar86 = true;
                      }
LAB_00133aa4:
                      uVar84 = (uint)local_8920;
                      if (!bVar86) {
                        uVar84 = 0;
                      }
                      uVar71 = (ulong)uVar84;
                      paVar68 = local_88f8;
                      if (!bVar86) {
                        bVar86 = false;
                      }
                      else {
LAB_00133ac3:
                        iVar49 = psVar54->todo;
                        uVar84 = iVar49 - 1;
                        psVar63 = (stbi__context *)(ulong)uVar84;
                        psVar54->todo = uVar84;
                        bVar86 = true;
                        if (iVar49 < 2) {
                          if (psVar54->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar54);
                            uVar62 = extraout_RDX_06;
                          }
                          if ((psVar54->marker & 0xf8) == 0xd0) {
                            psVar54->code_buffer = 0;
                            psVar54->code_bits = 0;
                            psVar63 = (stbi__context *)0x0;
                            psVar54->nomore = 0;
                            psVar54->img_comp[3].dc_pred = 0;
                            psVar54->img_comp[2].dc_pred = 0;
                            psVar54->img_comp[1].dc_pred = 0;
                            psVar54->img_comp[0].dc_pred = 0;
                            psVar54->marker = 0xff;
                            iVar49 = psVar54->restart_interval;
                            uVar62 = 0x7fffffff;
                            if (iVar49 == 0) {
                              iVar49 = 0x7fffffff;
                            }
                            psVar54->todo = iVar49;
                            psVar54->eob_run = 0;
                          }
                          else {
                            uVar71 = 1;
                            bVar86 = false;
                          }
                        }
                      }
                    }
                    iVar49 = (int)uVar71;
                    uVar84 = (uint)uVar62;
                    if (!bVar86) goto LAB_001342d5;
                    uVar84 = iVar79 + 1;
                    psVar63 = (stbi__context *)(ulong)uVar84;
                  } while (uVar84 != (uint)local_88f0);
                }
                uVar84 = (uint)uVar62;
                local_8964 = local_8964 + 1;
              } while (local_8964 != (int)local_88e8);
LAB_00133ebc:
              iVar49 = 1;
            }
          }
          else {
            iVar49 = 1;
            if (0 < psVar54->img_mcu_y) {
              iVar79 = 0;
              do {
                if (0 < psVar54->img_mcu_x) {
                  iVar77 = 0;
                  do {
                    if (0 < psVar54->scan_n) {
                      uVar71 = 0;
                      do {
                        local_8990 = uVar71;
                        uVar61 = psVar54->order[local_8990];
                        if (0 < psVar54->img_comp[(int)uVar61].v) {
                          iVar49 = 0;
                          bVar86 = true;
LAB_00133f27:
                          iVar51 = paVar1[(int)uVar61].h;
                          if (iVar51 < 1) goto LAB_00133f87;
                          iVar83 = 0;
                          while( true ) {
                            psVar63 = (stbi__context *)(ulong)uVar61;
                            iVar51 = stbi__jpeg_decode_block_prog_dc
                                               (psVar54,paVar1[(int)uVar61].coeff +
                                                        (iVar51 * iVar77 + iVar83 +
                                                        (paVar1[(int)uVar61].v * iVar79 + iVar49) *
                                                        paVar1[(int)uVar61].coeff_w) * 0x40,
                                                (stbi__huffman *)
                                                psVar54->huff_dc[paVar1[(int)uVar61].hd].fast,uVar61
                                               );
                            uVar84 = (uint)extraout_RDX_12;
                            uVar62 = extraout_RDX_12;
                            if (iVar51 == 0) break;
                            iVar83 = iVar83 + 1;
                            iVar51 = paVar1[(int)uVar61].h;
                            if (iVar51 <= iVar83) goto LAB_00133f87;
                          }
                          if (!bVar86) goto LAB_00133fa0;
LAB_001342bf:
                          iVar49 = 0;
                          goto LAB_001342d5;
                        }
LAB_00133fa0:
                        uVar71 = local_8990 + 1;
                      } while ((long)(local_8990 + 1) < (long)psVar54->scan_n);
                    }
                    uVar84 = (uint)uVar62;
                    iVar51 = psVar54->todo;
                    uVar61 = iVar51 - 1;
                    psVar63 = (stbi__context *)(ulong)uVar61;
                    psVar54->todo = uVar61;
                    iVar49 = 1;
                    if (iVar51 < 2) {
                      if (psVar54->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar54);
                        uVar84 = extraout_EDX_01;
                      }
                      if ((psVar54->marker & 0xf8) != 0xd0) goto LAB_001342d5;
                      psVar54->code_buffer = 0;
                      psVar54->code_bits = 0;
                      psVar63 = (stbi__context *)0x0;
                      psVar54->nomore = 0;
                      psVar54->img_comp[3].dc_pred = 0;
                      psVar54->img_comp[2].dc_pred = 0;
                      psVar54->img_comp[1].dc_pred = 0;
                      psVar54->img_comp[0].dc_pred = 0;
                      psVar54->marker = 0xff;
                      iVar49 = psVar54->restart_interval;
                      uVar62 = 0x7fffffff;
                      if (iVar49 == 0) {
                        iVar49 = 0x7fffffff;
                      }
                      psVar54->todo = iVar49;
                      psVar54->eob_run = 0;
                    }
                    iVar77 = iVar77 + 1;
                  } while (iVar77 < psVar54->img_mcu_x);
                }
                uVar84 = (uint)uVar62;
                iVar49 = 1;
                iVar79 = iVar79 + 1;
              } while (iVar79 < psVar54->img_mcu_y);
            }
          }
LAB_001342d5:
          if (iVar49 == 0) break;
          if (psVar54->marker == 0xff) {
            do {
              psVar59 = psVar54->s;
              if ((psVar59->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00134303:
                if (psVar59->img_buffer_end <= psVar59->img_buffer) goto LAB_00134330;
              }
              else {
                iVar49 = (*(psVar59->io).eof)(psVar59->io_user_data);
                if (iVar49 != 0) {
                  if (psVar59->read_from_callbacks != 0) goto LAB_00134303;
                  goto LAB_00134330;
                }
              }
              sVar43 = stbi__get8(psVar54->s);
            } while (sVar43 != 0xff);
            sVar43 = stbi__get8(psVar54->s);
            psVar54->marker = sVar43;
          }
LAB_00134330:
          bVar44 = stbi__get_marker(psVar54);
        } while( true );
      }
LAB_00135115:
      stbi__free_jpeg_components(psVar54,psVar54->s->img_n,uVar84);
    }
    else {
      pcVar55 = "bad req_comp";
LAB_001333e4:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar55;
    }
LAB_00135124:
    psVar59 = (stbi__context *)0x0;
    goto LAB_0013512a;
  }
  lVar56 = 0;
  do {
    sVar45 = stbi__get8(s);
    sVar43 = (&stbi__check_png_header_png_sig)[lVar56];
    if (sVar45 != sVar43) {
      *(char **)(in_FS_OFFSET + -0x10) = "bad png sig";
      break;
    }
    lVar56 = lVar56 + 1;
  } while (lVar56 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar45 == sVar43) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar49 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      data_00 = (stbi__uint16 *)local_88a8.history;
      uVar65 = local_88a8._0_8_;
      psVar81 = (stbi__uint16 *)0x0;
      if (iVar49 != 0) {
        iVar49 = 8;
        if ((8 < local_88a8.flags) && (iVar49 = 0x10, local_88a8.flags != 0x10)) {
          pcVar55 = "bad bits_per_channel";
          goto LAB_0013345f;
        }
        ri->bits_per_channel = iVar49;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar49 = *(int *)(local_88a8._0_8_ + 0xc), iVar49 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar49,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar49,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar65 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *local_8918 = *(stbi__uint32 *)local_88a8._0_8_;
        *local_8910 = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar81 = data_00;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar81;
    }
    pcVar55 = "bad req_comp";
    goto LAB_0013345f;
  }
  sVar43 = stbi__get8(s);
  if ((sVar43 == 'B') && (sVar43 = stbi__get8(s), sVar43 == 'M')) {
    stbi__get32le(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get32le(s);
    sVar53 = stbi__get32le(s);
    if (((sVar53 < 0x39) && ((0x100010000001000U >> ((ulong)sVar53 & 0x3f) & 1) != 0)) ||
       ((sVar53 == 0x7c || (sVar53 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      uStack_892c = 0xff;
      pvVar57 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8948);
      if (pvVar57 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar53 = s->img_y;
      uVar84 = -sVar53;
      if (0 < (int)sVar53) {
        uVar84 = sVar53;
      }
      s->img_y = uVar84;
      if ((0x1000000 < uVar84) || (uVar61 = s->img_x, 0x1000000 < uVar61)) {
LAB_001352e7:
        pcVar55 = "too large";
        goto LAB_0013345f;
      }
      uVar37 = local_8948._0_4_;
      uVar38 = local_8948._8_4_;
      if (local_8948._8_4_ == 0xc) {
        if ((int)local_8948._0_4_ < 0x18) {
          uVar50 = ((local_8948._4_4_ - local_8928) + -0x18) / 3;
        }
        else {
LAB_001351c1:
          uVar50 = 0;
        }
      }
      else {
        if (0xf < (int)local_8948._0_4_) goto LAB_001351c1;
        uVar50 = local_8948._4_4_ - (local_8928 + local_8948._8_4_) >> 2;
      }
      uVar80 = uStack_893c;
      z = local_8938._0_4_;
      z_00 = local_8938._4_4_;
      uVar39 = local_8938._8_4_;
      uVar67 = uStack_892c;
      if ((uVar50 == 0) &&
         (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
          (stbi_uc *)(long)(int)local_8948._4_4_)) {
        pcVar55 = "bad offset";
        goto LAB_0013345f;
      }
      local_8908 = (stbi__int16 (*) [512])CONCAT44(local_8908._4_4_,local_8938._8_4_);
      s->img_n = 4 - (uint)(local_8938._8_4_ == 0 ||
                           local_8948._0_4_ == 0x18 && local_8938._8_4_ == 0xff000000);
      iVar49 = req_comp;
      if (req_comp < 3) {
        iVar49 = s->img_n;
      }
      iVar79 = stbi__mad3sizes_valid(iVar49,uVar61,uVar84,0);
      if (iVar79 == 0) goto LAB_001352e7;
      uVar65 = 0;
      local_88d8 = sVar53;
      puVar64 = (uchar *)stbi__malloc_mad3(iVar49,uVar61,uVar84,0);
      if (puVar64 == (uchar *)0x0) {
        pcVar55 = "outofmem";
        goto LAB_0013345f;
      }
      if ((int)uVar37 < 0x10) {
        if (0x100 < (int)uVar50 || uVar50 == 0) {
          free(puVar64);
          pcVar55 = "invalid";
          goto LAB_0013345f;
        }
        if (0 < (int)uVar50) {
          uVar71 = 0;
          do {
            sVar43 = stbi__get8(s);
            local_88a8.pal[uVar71 - 0xd][2] = sVar43;
            sVar43 = stbi__get8(s);
            local_88a8.pal[uVar71 - 0xd][1] = sVar43;
            sVar43 = stbi__get8(s);
            local_88a8.pal[uVar71 - 0xd][0] = sVar43;
            if (uVar38 != 0xc) {
              stbi__get8(s);
            }
            local_88a8.pal[uVar71 - 0xd][3] = 0xff;
            uVar71 = uVar71 + 1;
          } while (uVar50 != uVar71);
        }
        stbi__skip(s,(uVar50 * (uVar38 == 0xc | 0xfffffffc) + local_8948._4_4_) -
                     (uVar38 + local_8928));
        if (uVar37 == 8) {
          uVar84 = s->img_x;
        }
        else if (uVar37 == 4) {
          uVar84 = s->img_x + 1 >> 1;
        }
        else {
          if (uVar37 != 1) {
            free(puVar64);
            pcVar55 = "bad bpp";
            goto LAB_0013345f;
          }
          uVar84 = s->img_x + 7 >> 3;
        }
        local_8998 = -uVar84 & 3;
        if (uVar37 == 1) {
          if (0 < (int)s->img_y) {
            iVar79 = 0;
            iVar77 = 0;
            do {
              bVar44 = stbi__get8(s);
              uVar84 = (uint)bVar44;
              uVar61 = 7;
              sVar53 = 1;
              do {
                sVar7 = s->img_x;
                if ((int)sVar7 <= (int)(sVar53 - 1)) break;
                uVar71 = (ulong)((uVar84 >> (uVar61 & 0x1f) & 1) != 0);
                puVar64[iVar79] = local_88a8.pal[uVar71 - 0xd][0];
                puVar64[(long)iVar79 + 1] = local_88a8.pal[uVar71 - 0xd][1];
                puVar64[(long)iVar79 + 2] = local_88a8.pal[uVar71 - 0xd][2];
                iVar51 = iVar79 + 3;
                if (iVar49 == 4) {
                  puVar64[(long)iVar79 + 3] = 0xff;
                  iVar51 = iVar79 + 4;
                }
                iVar79 = iVar51;
                if (sVar53 != sVar7) {
                  if ((int)uVar61 < 1) {
                    bVar44 = stbi__get8(s);
                    uVar84 = (uint)bVar44;
                    uVar61 = 7;
                  }
                  else {
                    uVar61 = uVar61 - 1;
                  }
                }
                bVar86 = sVar53 != sVar7;
                sVar53 = sVar53 + 1;
              } while (bVar86);
              stbi__skip(s,local_8998);
              iVar77 = iVar77 + 1;
            } while (iVar77 < (int)s->img_y);
          }
        }
        else if (0 < (int)s->img_y) {
          uVar71 = 0;
          iVar79 = 0;
          do {
            if (0 < (int)s->img_x) {
              iVar77 = 0;
              do {
                bVar44 = stbi__get8(s);
                uVar61 = bVar44 & 0xf;
                uVar84 = (uint)(bVar44 >> 4);
                if (uVar37 != 4) {
                  uVar84 = (uint)bVar44;
                }
                uVar62 = (ulong)uVar84;
                if (uVar37 != 4) {
                  uVar61 = 0;
                }
                lVar56 = (long)(int)uVar71;
                uVar85 = lVar56 + 3;
                puVar64[lVar56] = local_88a8.pal[uVar62 - 0xd][0];
                puVar64[lVar56 + 1] = local_88a8.pal[uVar62 - 0xd][1];
                puVar64[lVar56 + 2] = local_88a8.pal[uVar62 - 0xd][2];
                if (iVar49 == 4) {
                  puVar64[lVar56 + 3] = 0xff;
                  uVar85 = (ulong)((int)uVar71 + 4);
                }
                sVar53 = s->img_x;
                if (iVar77 + 1U == sVar53) {
LAB_001357fc:
                  uVar71 = uVar85 & 0xffffffff;
                }
                else {
                  if (uVar37 == 8) {
                    bVar44 = stbi__get8(s);
                    uVar61 = (uint)bVar44;
                  }
                  lVar56 = (long)(int)uVar85;
                  uVar71 = lVar56 + 3;
                  uVar62 = (ulong)uVar61;
                  puVar64[lVar56] = local_88a8.pal[uVar62 - 0xd][0];
                  puVar64[lVar56 + 1] = local_88a8.pal[uVar62 - 0xd][1];
                  puVar64[lVar56 + 2] = local_88a8.pal[uVar62 - 0xd][2];
                  if (iVar49 == 4) {
                    uVar85 = (ulong)((int)uVar85 + 4);
                    puVar64[lVar56 + 3] = 0xff;
                    goto LAB_001357fc;
                  }
                }
              } while ((iVar77 + 1U != sVar53) && (iVar77 = iVar77 + 2, iVar77 < (int)s->img_x));
            }
            stbi__skip(s,local_8998);
            iVar79 = iVar79 + 1;
          } while (iVar79 < (int)s->img_y);
        }
        goto LAB_00135b76;
      }
      stbi__skip(s,local_8948._4_4_ - (uVar38 + local_8928));
      if (uVar37 == 0x18) {
        iVar79 = -3;
LAB_00135484:
        local_88d4 = iVar79 * s->img_x & 3;
      }
      else {
        local_88d4 = 0;
        if (uVar37 == 0x10) {
          iVar79 = -2;
          goto LAB_00135484;
        }
      }
      iVar79 = 0;
      if (uVar37 == 0x18) {
        uVar71 = 0;
LAB_001354dc:
        bVar86 = false;
      }
      else {
        if (uVar37 != 0x20) {
          uVar71 = CONCAT71((int7)((ulong)uVar65 >> 8),1);
          goto LAB_001354dc;
        }
        uVar84 = z ^ 0xff00 | z_00 ^ 0xff;
        bVar86 = (uVar80 == 0xff0000 && uVar84 == 0) && uVar39 == 0xff000000;
        uVar71 = (ulong)CONCAT31((int3)(uVar84 >> 8),
                                 (uVar80 != 0xff0000 || uVar84 != 0) || uVar39 != 0xff000000);
      }
      iVar77 = 0;
      iVar51 = 0;
      iVar83 = 0;
      uVar62 = 0;
      uVar84 = 0;
      uVar61 = 0;
      uVar50 = 0;
      local_88fc = (uint)uVar71;
      if ((char)uVar71 == '\0') {
LAB_00135871:
        bVar30 = true;
        if (0 < (int)s->img_y) {
          local_8920 = (uchar *)CONCAT44(local_8920._4_4_,-iVar79);
          local_88f8 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88f8._4_4_,-iVar77);
          local_88e0 = (stbi__context *)CONCAT44(local_88e0._4_4_,8 - uVar84);
          local_88e8 = (ulong)uVar84;
          local_88bc = -iVar51;
          local_88c0 = 8 - uVar61;
          local_88b0 = (ulong)uVar61;
          local_88cc = -iVar83;
          local_88c8 = 8 - uVar50;
          local_88b8 = (ulong)uVar50;
          iVar125 = 0;
          iVar78 = 0;
          local_88f0 = uVar62;
          local_88c4 = iVar83;
          do {
            local_88d0 = iVar78;
            if ((char)uVar71 == '\0') {
              if (0 < (int)s->img_x) {
                iVar83 = 0;
                do {
                  sVar43 = stbi__get8(s);
                  puVar64[(long)iVar125 + 2] = sVar43;
                  sVar43 = stbi__get8(s);
                  puVar64[(long)iVar125 + 1] = sVar43;
                  sVar43 = stbi__get8(s);
                  puVar64[iVar125] = sVar43;
                  bVar44 = 0xff;
                  if (bVar86) {
                    bVar44 = stbi__get8(s);
                  }
                  iVar78 = iVar125 + 3;
                  if (iVar49 == 4) {
                    puVar64[(long)iVar125 + 3] = bVar44;
                    iVar78 = iVar125 + 4;
                  }
                  iVar125 = iVar78;
                  uVar67 = uVar67 | bVar44;
                  iVar83 = iVar83 + 1;
                } while (iVar83 < (int)s->img_x);
              }
            }
            else if (0 < (int)s->img_x) {
              iVar83 = 0;
              do {
                if (uVar37 == 0x10) {
                  sVar43 = stbi__get8(s);
                  sVar45 = stbi__get8(s);
                  uVar84 = (uint)CONCAT11(sVar45,sVar43);
                }
                else {
                  uVar84 = stbi__get32le(s);
                }
                uVar61 = (uVar84 & uVar80) >> ((byte)iVar79 & 0x1f);
                if (iVar79 < 0) {
                  uVar61 = (uVar84 & uVar80) << ((byte)local_8920 & 0x1f);
                }
                uVar50 = (uVar84 & z) >> ((byte)iVar77 & 0x1f);
                if (iVar77 < 0) {
                  uVar50 = (uVar84 & z) << ((byte)local_88f8 & 0x1f);
                }
                iVar78 = *(int *)(stbi__shiftsigned_mul_table + local_88e8 * 4);
                bVar44 = stbi__shiftsigned_shift_table[local_88e8 * 4];
                uVar29 = (uVar84 & z_00) >> ((byte)iVar51 & 0x1f);
                if (iVar51 < 0) {
                  uVar29 = (uVar84 & z_00) << ((byte)local_88bc & 0x1f);
                }
                iVar52 = *(int *)(stbi__shiftsigned_mul_table + local_88b0 * 4);
                bVar48 = stbi__shiftsigned_shift_table[local_88b0 * 4];
                puVar64[iVar125] =
                     (uchar)((int)((uVar61 >> (8U - (char)uVar62 & 0x1f)) *
                                  *(int *)(stbi__shiftsigned_mul_table + local_88f0 * 4)) >>
                            (stbi__shiftsigned_shift_table[local_88f0 * 4] & 0x1f));
                puVar64[(long)iVar125 + 1] =
                     (uchar)((int)((uVar50 >> ((byte)local_88e0 & 0x1f)) * iVar78) >>
                            (bVar44 & 0x1f));
                puVar64[(long)iVar125 + 2] =
                     (uchar)((int)((uVar29 >> ((byte)local_88c0 & 0x1f)) * iVar52) >>
                            (bVar48 & 0x1f));
                if ((uint)local_8908 == 0) {
                  uVar84 = 0xff;
                }
                else {
                  uVar61 = (uVar84 & (uint)local_8908) >> ((byte)local_88c4 & 0x1f);
                  if (local_88c4 < 0) {
                    uVar61 = (uVar84 & (uint)local_8908) << ((byte)local_88cc & 0x1f);
                  }
                  uVar84 = (int)((uVar61 >> ((byte)local_88c8 & 0x1f)) *
                                *(int *)(stbi__shiftsigned_mul_table + local_88b8 * 4)) >>
                           (stbi__shiftsigned_shift_table[local_88b8 * 4] & 0x1f);
                }
                iVar78 = iVar125 + 3;
                if (iVar49 == 4) {
                  puVar64[(long)iVar125 + 3] = (uchar)uVar84;
                  iVar78 = iVar125 + 4;
                }
                iVar125 = iVar78;
                uVar67 = uVar67 | uVar84;
                iVar83 = iVar83 + 1;
              } while (iVar83 < (int)s->img_x);
            }
            stbi__skip(s,local_88d4);
            iVar78 = local_88d0 + 1;
            uVar71 = (ulong)local_88fc;
          } while (iVar78 < (int)s->img_y);
          bVar30 = true;
        }
      }
      else {
        if (z_00 != 0 && (z != 0 && uVar80 != 0)) {
          iVar79 = stbi__high_bit(uVar80);
          iVar77 = stbi__bitcount(uVar80);
          local_8920 = (uchar *)CONCAT44(local_8920._4_4_,iVar77);
          iVar77 = stbi__high_bit(z);
          uVar84 = stbi__bitcount(z);
          iVar51 = stbi__high_bit(z_00);
          uVar61 = stbi__bitcount(z_00);
          uVar50 = (uint)local_8908;
          iVar83 = stbi__high_bit((uint)local_8908);
          uVar50 = stbi__bitcount(uVar50);
          uVar62 = (ulong)local_8920 & 0xffffffff;
          uVar71 = (ulong)local_88fc;
          if ((uVar50 < 9 && uVar61 < 9) && (uVar84 < 9 && (uint)local_8920 < 9)) {
            iVar79 = iVar79 + -7;
            iVar77 = iVar77 + -7;
            iVar51 = iVar51 + -7;
            iVar83 = iVar83 + -7;
            goto LAB_00135871;
          }
        }
        free(puVar64);
        *(char **)(in_FS_OFFSET + -0x10) = "bad masks";
        bVar30 = false;
      }
      if (!bVar30) {
        return (void *)0x0;
      }
LAB_00135b76:
      auVar36 = _DAT_00160cc0;
      auVar35 = _DAT_00160cb0;
      auVar34 = _DAT_00160ca0;
      auVar33 = _DAT_00160c90;
      auVar32 = _DAT_0015c0d0;
      auVar31 = _DAT_0015c0b0;
      auVar126 = _DAT_0015c090;
      if (((iVar49 == 4) && (uVar67 == 0)) &&
         (uVar84 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar84)) {
        uVar61 = uVar84 >> 2;
        auVar87._4_4_ = 0;
        auVar87._0_4_ = uVar61;
        auVar87._8_4_ = uVar61;
        auVar87._12_4_ = 0;
        puVar60 = puVar64 + uVar84;
        uVar71 = 0;
        do {
          auVar105._8_4_ = (int)uVar71;
          auVar105._0_8_ = uVar71;
          auVar105._12_4_ = (int)(uVar71 >> 0x20);
          auVar107 = auVar87 | auVar126;
          auVar109 = (auVar105 | auVar31) ^ auVar126;
          iVar79 = auVar107._0_4_;
          iVar78 = -(uint)(iVar79 < auVar109._0_4_);
          iVar77 = auVar107._4_4_;
          auVar111._4_4_ = -(uint)(iVar77 < auVar109._4_4_);
          iVar51 = auVar107._8_4_;
          iVar125 = -(uint)(iVar51 < auVar109._8_4_);
          iVar83 = auVar107._12_4_;
          auVar111._12_4_ = -(uint)(iVar83 < auVar109._12_4_);
          auVar88._4_4_ = iVar78;
          auVar88._0_4_ = iVar78;
          auVar88._8_4_ = iVar125;
          auVar88._12_4_ = iVar125;
          auVar88 = pshuflw(in_XMM1,auVar88,0xe8);
          auVar110._4_4_ = -(uint)(auVar109._4_4_ == iVar77);
          auVar110._12_4_ = -(uint)(auVar109._12_4_ == iVar83);
          auVar110._0_4_ = auVar110._4_4_;
          auVar110._8_4_ = auVar110._12_4_;
          auVar97 = pshuflw(in_XMM2,auVar110,0xe8);
          auVar111._0_4_ = auVar111._4_4_;
          auVar111._8_4_ = auVar111._12_4_;
          auVar109 = pshuflw(auVar88,auVar111,0xe8);
          auVar107._8_4_ = 0xffffffff;
          auVar107._0_8_ = 0xffffffffffffffff;
          auVar107._12_4_ = 0xffffffff;
          auVar107 = (auVar109 | auVar97 & auVar88) ^ auVar107;
          auVar107 = packssdw(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *puVar60 = 0xff;
          }
          auVar97._4_4_ = iVar78;
          auVar97._0_4_ = iVar78;
          auVar97._8_4_ = iVar125;
          auVar97._12_4_ = iVar125;
          auVar111 = auVar110 & auVar97 | auVar111;
          auVar107 = packssdw(auVar111,auVar111);
          auVar109._8_4_ = 0xffffffff;
          auVar109._0_8_ = 0xffffffffffffffff;
          auVar109._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 ^ auVar109,auVar107 ^ auVar109);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._0_4_ >> 8 & 1) != 0) {
            puVar60[-4] = 0xff;
          }
          auVar107 = (auVar105 | auVar32) ^ auVar126;
          auVar98._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar98._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar98._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar98._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar112._4_4_ = auVar98._0_4_;
          auVar112._0_4_ = auVar98._0_4_;
          auVar112._8_4_ = auVar98._8_4_;
          auVar112._12_4_ = auVar98._8_4_;
          iVar78 = -(uint)(auVar107._4_4_ == iVar77);
          iVar125 = -(uint)(auVar107._12_4_ == iVar83);
          auVar17._4_4_ = iVar78;
          auVar17._0_4_ = iVar78;
          auVar17._8_4_ = iVar125;
          auVar17._12_4_ = iVar125;
          auVar122._4_4_ = auVar98._4_4_;
          auVar122._0_4_ = auVar98._4_4_;
          auVar122._8_4_ = auVar98._12_4_;
          auVar122._12_4_ = auVar98._12_4_;
          auVar107 = auVar17 & auVar112 | auVar122;
          auVar107 = packssdw(auVar107,auVar107);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 ^ auVar8,auVar107 ^ auVar8);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._0_4_ >> 0x10 & 1) != 0) {
            puVar60[-8] = 0xff;
          }
          auVar107 = pshufhw(auVar107,auVar112,0x84);
          auVar18._4_4_ = iVar78;
          auVar18._0_4_ = iVar78;
          auVar18._8_4_ = iVar125;
          auVar18._12_4_ = iVar125;
          auVar109 = pshufhw(auVar98,auVar18,0x84);
          auVar88 = pshufhw(auVar107,auVar122,0x84);
          auVar89._8_4_ = 0xffffffff;
          auVar89._0_8_ = 0xffffffffffffffff;
          auVar89._12_4_ = 0xffffffff;
          auVar89 = (auVar88 | auVar109 & auVar107) ^ auVar89;
          auVar107 = packssdw(auVar89,auVar89);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._0_4_ >> 0x18 & 1) != 0) {
            puVar60[-0xc] = 0xff;
          }
          auVar107 = (auVar105 | auVar36) ^ auVar126;
          auVar99._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar99._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar99._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar99._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar19._4_4_ = auVar99._0_4_;
          auVar19._0_4_ = auVar99._0_4_;
          auVar19._8_4_ = auVar99._8_4_;
          auVar19._12_4_ = auVar99._8_4_;
          auVar109 = pshuflw(auVar122,auVar19,0xe8);
          auVar90._0_4_ = -(uint)(auVar107._0_4_ == iVar79);
          auVar90._4_4_ = -(uint)(auVar107._4_4_ == iVar77);
          auVar90._8_4_ = -(uint)(auVar107._8_4_ == iVar51);
          auVar90._12_4_ = -(uint)(auVar107._12_4_ == iVar83);
          auVar113._4_4_ = auVar90._4_4_;
          auVar113._0_4_ = auVar90._4_4_;
          auVar113._8_4_ = auVar90._12_4_;
          auVar113._12_4_ = auVar90._12_4_;
          auVar107 = pshuflw(auVar90,auVar113,0xe8);
          auVar114._4_4_ = auVar99._4_4_;
          auVar114._0_4_ = auVar99._4_4_;
          auVar114._8_4_ = auVar99._12_4_;
          auVar114._12_4_ = auVar99._12_4_;
          auVar88 = pshuflw(auVar99,auVar114,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 & auVar109,(auVar88 | auVar107 & auVar109) ^ auVar9);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar60[-0x10] = 0xff;
          }
          auVar20._4_4_ = auVar99._0_4_;
          auVar20._0_4_ = auVar99._0_4_;
          auVar20._8_4_ = auVar99._8_4_;
          auVar20._12_4_ = auVar99._8_4_;
          auVar114 = auVar113 & auVar20 | auVar114;
          auVar88 = packssdw(auVar114,auVar114);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107,auVar88 ^ auVar10);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._4_2_ >> 8 & 1) != 0) {
            puVar60[-0x14] = 0xff;
          }
          auVar107 = (auVar105 | auVar35) ^ auVar126;
          auVar100._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar100._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar100._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar100._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar115._4_4_ = auVar100._0_4_;
          auVar115._0_4_ = auVar100._0_4_;
          auVar115._8_4_ = auVar100._8_4_;
          auVar115._12_4_ = auVar100._8_4_;
          iVar78 = -(uint)(auVar107._4_4_ == iVar77);
          iVar125 = -(uint)(auVar107._12_4_ == iVar83);
          auVar21._4_4_ = iVar78;
          auVar21._0_4_ = iVar78;
          auVar21._8_4_ = iVar125;
          auVar21._12_4_ = iVar125;
          auVar123._4_4_ = auVar100._4_4_;
          auVar123._0_4_ = auVar100._4_4_;
          auVar123._8_4_ = auVar100._12_4_;
          auVar123._12_4_ = auVar100._12_4_;
          auVar107 = auVar21 & auVar115 | auVar123;
          auVar107 = packssdw(auVar107,auVar107);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 ^ auVar11,auVar107 ^ auVar11);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar60[-0x18] = 0xff;
          }
          auVar107 = pshufhw(auVar107,auVar115,0x84);
          auVar22._4_4_ = iVar78;
          auVar22._0_4_ = iVar78;
          auVar22._8_4_ = iVar125;
          auVar22._12_4_ = iVar125;
          auVar109 = pshufhw(auVar100,auVar22,0x84);
          auVar88 = pshufhw(auVar107,auVar123,0x84);
          auVar91._8_4_ = 0xffffffff;
          auVar91._0_8_ = 0xffffffffffffffff;
          auVar91._12_4_ = 0xffffffff;
          auVar91 = (auVar88 | auVar109 & auVar107) ^ auVar91;
          auVar107 = packssdw(auVar91,auVar91);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._6_2_ >> 8 & 1) != 0) {
            puVar60[-0x1c] = 0xff;
          }
          auVar107 = (auVar105 | auVar34) ^ auVar126;
          auVar101._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar101._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar101._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar101._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar23._4_4_ = auVar101._0_4_;
          auVar23._0_4_ = auVar101._0_4_;
          auVar23._8_4_ = auVar101._8_4_;
          auVar23._12_4_ = auVar101._8_4_;
          auVar109 = pshuflw(auVar123,auVar23,0xe8);
          auVar92._0_4_ = -(uint)(auVar107._0_4_ == iVar79);
          auVar92._4_4_ = -(uint)(auVar107._4_4_ == iVar77);
          auVar92._8_4_ = -(uint)(auVar107._8_4_ == iVar51);
          auVar92._12_4_ = -(uint)(auVar107._12_4_ == iVar83);
          auVar116._4_4_ = auVar92._4_4_;
          auVar116._0_4_ = auVar92._4_4_;
          auVar116._8_4_ = auVar92._12_4_;
          auVar116._12_4_ = auVar92._12_4_;
          auVar107 = pshuflw(auVar92,auVar116,0xe8);
          auVar117._4_4_ = auVar101._4_4_;
          auVar117._0_4_ = auVar101._4_4_;
          auVar117._8_4_ = auVar101._12_4_;
          auVar117._12_4_ = auVar101._12_4_;
          auVar88 = pshuflw(auVar101,auVar117,0xe8);
          auVar102._8_4_ = 0xffffffff;
          auVar102._0_8_ = 0xffffffffffffffff;
          auVar102._12_4_ = 0xffffffff;
          auVar102 = (auVar88 | auVar107 & auVar109) ^ auVar102;
          auVar88 = packssdw(auVar102,auVar102);
          auVar107 = packsswb(auVar107 & auVar109,auVar88);
          if ((auVar107 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar60[-0x20] = 0xff;
          }
          auVar24._4_4_ = auVar101._0_4_;
          auVar24._0_4_ = auVar101._0_4_;
          auVar24._8_4_ = auVar101._8_4_;
          auVar24._12_4_ = auVar101._8_4_;
          auVar117 = auVar116 & auVar24 | auVar117;
          auVar88 = packssdw(auVar117,auVar117);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar88 = packssdw(auVar88 ^ auVar12,auVar88 ^ auVar12);
          auVar107 = packsswb(auVar107,auVar88);
          if ((auVar107._8_2_ >> 8 & 1) != 0) {
            puVar60[-0x24] = 0xff;
          }
          auVar107 = (auVar105 | auVar33) ^ auVar126;
          auVar103._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar103._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar103._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar103._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar118._4_4_ = auVar103._0_4_;
          auVar118._0_4_ = auVar103._0_4_;
          auVar118._8_4_ = auVar103._8_4_;
          auVar118._12_4_ = auVar103._8_4_;
          iVar78 = -(uint)(auVar107._4_4_ == iVar77);
          iVar125 = -(uint)(auVar107._12_4_ == iVar83);
          auVar25._4_4_ = iVar78;
          auVar25._0_4_ = iVar78;
          auVar25._8_4_ = iVar125;
          auVar25._12_4_ = iVar125;
          auVar124._4_4_ = auVar103._4_4_;
          auVar124._0_4_ = auVar103._4_4_;
          auVar124._8_4_ = auVar103._12_4_;
          auVar124._12_4_ = auVar103._12_4_;
          auVar107 = auVar25 & auVar118 | auVar124;
          auVar107 = packssdw(auVar107,auVar107);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 ^ auVar13,auVar107 ^ auVar13);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar60[-0x28] = 0xff;
          }
          auVar107 = pshufhw(auVar107,auVar118,0x84);
          auVar26._4_4_ = iVar78;
          auVar26._0_4_ = iVar78;
          auVar26._8_4_ = iVar125;
          auVar26._12_4_ = iVar125;
          auVar109 = pshufhw(auVar103,auVar26,0x84);
          auVar88 = pshufhw(auVar107,auVar124,0x84);
          auVar93._8_4_ = 0xffffffff;
          auVar93._0_8_ = 0xffffffffffffffff;
          auVar93._12_4_ = 0xffffffff;
          auVar93 = (auVar88 | auVar109 & auVar107) ^ auVar93;
          auVar107 = packssdw(auVar93,auVar93);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._10_2_ >> 8 & 1) != 0) {
            puVar60[-0x2c] = 0xff;
          }
          auVar107 = (auVar105 | _DAT_00160c80) ^ auVar126;
          auVar104._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar104._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar104._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar104._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar27._4_4_ = auVar104._0_4_;
          auVar27._0_4_ = auVar104._0_4_;
          auVar27._8_4_ = auVar104._8_4_;
          auVar27._12_4_ = auVar104._8_4_;
          auVar109 = pshuflw(auVar124,auVar27,0xe8);
          auVar94._0_4_ = -(uint)(auVar107._0_4_ == iVar79);
          auVar94._4_4_ = -(uint)(auVar107._4_4_ == iVar77);
          auVar94._8_4_ = -(uint)(auVar107._8_4_ == iVar51);
          auVar94._12_4_ = -(uint)(auVar107._12_4_ == iVar83);
          auVar119._4_4_ = auVar94._4_4_;
          auVar119._0_4_ = auVar94._4_4_;
          auVar119._8_4_ = auVar94._12_4_;
          auVar119._12_4_ = auVar94._12_4_;
          auVar107 = pshuflw(auVar94,auVar119,0xe8);
          auVar120._4_4_ = auVar104._4_4_;
          auVar120._0_4_ = auVar104._4_4_;
          auVar120._8_4_ = auVar104._12_4_;
          auVar120._12_4_ = auVar104._12_4_;
          auVar88 = pshuflw(auVar104,auVar120,0xe8);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 & auVar109,(auVar88 | auVar107 & auVar109) ^ auVar14);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar60[-0x30] = 0xff;
          }
          auVar28._4_4_ = auVar104._0_4_;
          auVar28._0_4_ = auVar104._0_4_;
          auVar28._8_4_ = auVar104._8_4_;
          auVar28._12_4_ = auVar104._8_4_;
          auVar120 = auVar119 & auVar28 | auVar120;
          auVar88 = packssdw(auVar120,auVar120);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107,auVar88 ^ auVar15);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107._12_2_ >> 8 & 1) != 0) {
            puVar60[-0x34] = 0xff;
          }
          auVar107 = (auVar105 | _DAT_00160c70) ^ auVar126;
          auVar95._0_4_ = -(uint)(iVar79 < auVar107._0_4_);
          auVar95._4_4_ = -(uint)(iVar77 < auVar107._4_4_);
          auVar95._8_4_ = -(uint)(iVar51 < auVar107._8_4_);
          auVar95._12_4_ = -(uint)(iVar83 < auVar107._12_4_);
          auVar121._4_4_ = auVar95._0_4_;
          auVar121._0_4_ = auVar95._0_4_;
          auVar121._8_4_ = auVar95._8_4_;
          auVar121._12_4_ = auVar95._8_4_;
          auVar106._4_4_ = -(uint)(auVar107._4_4_ == iVar77);
          auVar106._12_4_ = -(uint)(auVar107._12_4_ == iVar83);
          auVar106._0_4_ = auVar106._4_4_;
          auVar106._8_4_ = auVar106._12_4_;
          auVar108._4_4_ = auVar95._4_4_;
          auVar108._0_4_ = auVar95._4_4_;
          auVar108._8_4_ = auVar95._12_4_;
          auVar108._12_4_ = auVar95._12_4_;
          auVar88 = auVar106 & auVar121 | auVar108;
          auVar107 = packssdw(auVar95,auVar88);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar107 = packssdw(auVar107 ^ auVar16,auVar107 ^ auVar16);
          auVar107 = packsswb(auVar107,auVar107);
          if ((auVar107 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar60[-0x38] = 0xff;
          }
          auVar107 = pshufhw(auVar107,auVar121,0x84);
          in_XMM2 = pshufhw(auVar88,auVar106,0x84);
          in_XMM2 = in_XMM2 & auVar107;
          auVar107 = pshufhw(auVar107,auVar108,0x84);
          auVar96._8_4_ = 0xffffffff;
          auVar96._0_8_ = 0xffffffffffffffff;
          auVar96._12_4_ = 0xffffffff;
          auVar96 = (auVar107 | in_XMM2) ^ auVar96;
          auVar107 = packssdw(auVar96,auVar96);
          in_XMM1 = packsswb(auVar107,auVar107);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            puVar60[-0x3c] = 0xff;
          }
          uVar71 = uVar71 + 0x10;
          puVar60 = puVar60 + -0x40;
        } while ((uVar61 + 0x10 & 0x3ffffff0) != uVar71);
      }
      if (0 < (int)local_88d8) {
        uVar84 = (int)s->img_y >> 1;
        if (0 < (int)uVar84) {
          uVar50 = s->img_x * iVar49;
          uVar61 = (s->img_y - 1) * uVar50;
          uVar80 = 0;
          uVar71 = 0;
          do {
            if (0 < (int)uVar50) {
              uVar62 = 0;
              do {
                uVar3 = puVar64[uVar62 + uVar80];
                puVar64[uVar62 + uVar80] = puVar64[uVar62 + uVar61];
                puVar64[uVar62 + uVar61] = uVar3;
                uVar62 = uVar62 + 1;
              } while (uVar50 != uVar62);
            }
            uVar71 = uVar71 + 1;
            uVar61 = uVar61 - uVar50;
            uVar80 = uVar80 + uVar50;
          } while (uVar71 != uVar84);
        }
      }
      if ((iVar49 != req_comp && req_comp != 0) &&
         (puVar64 = stbi__convert_format(puVar64,iVar49,req_comp,s->img_x,s->img_y),
         puVar64 == (uchar *)0x0)) {
        return (void *)0x0;
      }
      *local_8918 = s->img_x;
      *local_8910 = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar64;
      }
      return puVar64;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar49 = stbi__gif_test(s);
  if (iVar49 != 0) {
    memset(&local_88a8,0,0x8870);
    psVar59 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar69);
    if (psVar59 == s) {
      psVar59 = (stbi__context *)0x0;
    }
    if (psVar59 == (stbi__context *)0x0) {
      if (local_88a8.out != (stbi_uc *)0x0) {
        free(local_88a8.out);
      }
      psVar59 = (stbi__context *)0x0;
    }
    else {
      *local_8918 = local_88a8.w;
      *local_8910 = local_88a8.h;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar59 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar59,4,req_comp,local_88a8.w,local_88a8.h);
      }
    }
    free(local_88a8.history);
    psVar54 = (stbi__jpeg *)local_88a8.background;
LAB_0013512a:
    free(psVar54);
    return psVar59;
  }
  sVar53 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar53 == 0x38425053) {
    pvVar57 = stbi__psd_load(s,(int *)local_8918,(int *)local_8910,comp,req_comp,ri,bpc);
    return pvVar57;
  }
  iVar49 = stbi__pic_test(s);
  if (iVar49 != 0) {
    pvVar57 = stbi__pic_load(s,(int *)local_8918,(int *)local_8910,comp,req_comp,ri_00);
    return pvVar57;
  }
  iVar49 = stbi__pnm_test(s);
  if (iVar49 != 0) {
    pvVar57 = stbi__pnm_load(s,(int *)local_8918,(int *)local_8910,comp,req_comp,ri_00);
    return pvVar57;
  }
  iVar49 = stbi__hdr_test(s);
  psVar41 = local_8910;
  psVar40 = local_8918;
  if (iVar49 != 0) {
    data_01 = stbi__hdr_load(s,(int *)local_8918,(int *)local_8910,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar69 = stbi__hdr_to_ldr(data_01,*psVar40,*psVar41,req_comp);
    return psVar69;
  }
  iVar49 = stbi__tga_test(s);
  if (iVar49 != 0) {
    pvVar57 = stbi__tga_load(s,(int *)local_8918,(int *)local_8910,comp,req_comp,ri_00);
    return pvVar57;
  }
  pcVar55 = "unknown image type";
LAB_0013345f:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar55;
  return (void *)0x0;
LAB_00133f87:
  iVar49 = iVar49 + 1;
  bVar86 = iVar49 < paVar1[(int)uVar61].v;
  if (paVar1[(int)uVar61].v <= iVar49) goto LAB_00133fa0;
  goto LAB_00133f27;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}